

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TitleSpecsOf.hpp
# Opt level: O2

void __thiscall
sciplot::TitleSpecsOf<sciplot::LegendSpecs>::TitleSpecsOf
          (TitleSpecsOf<sciplot::LegendSpecs> *this,void **vtt)

{
  void *pvVar1;
  allocator<char> local_41;
  string local_40;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  (this->m_title)._M_dataplus._M_p = (pointer)&(this->m_title).field_2;
  (this->m_title)._M_string_length = 0;
  (this->m_title).field_2._M_local_buf[0] = '\0';
  TextSpecs::TextSpecs(&this->m_text_specs);
  OffsetSpecs::OffsetSpecs(&this->m_offset_specs);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  title(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

TitleSpecsOf<DerivedSpecs>::TitleSpecsOf()
{
    title("");
}